

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLDateTime::serialize(XMLDateTime *this,XSerializeEngine *serEng)

{
  long lVar1;
  XMLSize_t dataLen;
  XMLSize_t local_28;
  
  XMLNumber::serialize(&this->super_XMLNumber,serEng);
  if (serEng->fStoreLoad != 0) {
    lVar1 = 0;
    do {
      XSerializeEngine::operator>>(serEng,(int *)((long)this->fValue + lVar1));
      lVar1 = lVar1 + 4;
    } while (lVar1 != 0x20);
    lVar1 = 0;
    do {
      XSerializeEngine::operator>>(serEng,(int *)((long)this->fTimeZone + lVar1));
      lVar1 = lVar1 + 4;
    } while (lVar1 == 4);
    XSerializeEngine::operator>>(serEng,&this->fStart);
    XSerializeEngine::operator>>(serEng,&this->fEnd);
    local_28 = 0;
    XSerializeEngine::readString(serEng,&this->fBuffer,&this->fBufferMaxLen,&local_28,true);
    return;
  }
  lVar1 = 0;
  do {
    XSerializeEngine::operator<<(serEng,this->fValue[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  lVar1 = 0;
  do {
    XSerializeEngine::operator<<(serEng,this->fTimeZone[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  XSerializeEngine::operator<<(serEng,this->fStart);
  XSerializeEngine::operator<<(serEng,this->fEnd);
  XSerializeEngine::writeString(serEng,this->fBuffer,this->fBufferMaxLen,true);
  return;
}

Assistant:

void XMLDateTime::serialize(XSerializeEngine& serEng)
{
    //REVISIT: may not need to call base since it does nothing
    XMLNumber::serialize(serEng);

    int i = 0;

    if (serEng.isStoring())
    {
        for (i = 0; i < TOTAL_SIZE; i++)
        {
            serEng<<fValue[i];
        }

        for (i = 0; i < TIMEZONE_ARRAYSIZE; i++)
        {
            serEng<<fTimeZone[i];
        }

        serEng<<(unsigned long)fStart;
        serEng<<(unsigned long)fEnd;

        serEng.writeString(fBuffer, fBufferMaxLen, XSerializeEngine::toWriteBufferLen);
    }
    else
    {
        for (i = 0; i < TOTAL_SIZE; i++)
        {
            serEng>>fValue[i];
        }

        for (i = 0; i < TIMEZONE_ARRAYSIZE; i++)
        {
            serEng>>fTimeZone[i];
        }

        serEng>>(unsigned long&)fStart;
        serEng>>(unsigned long&)fEnd;

        XMLSize_t dataLen = 0;
        serEng.readString(fBuffer, fBufferMaxLen, dataLen ,XSerializeEngine::toReadBufferLen);

    }

}